

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O0

bool_t apduRespIsValid(apdu_resp_t *resp)

{
  bool_t bVar1;
  void *in_RDI;
  undefined1 local_9;
  
  bVar1 = memIsValid(in_RDI,0x10);
  local_9 = false;
  if ((bVar1 != 0) && (local_9 = false, *(ulong *)((long)in_RDI + 8) < 0x10001)) {
    bVar1 = memIsValid((void *)((long)in_RDI + 0x10),*(size_t *)((long)in_RDI + 8));
    local_9 = bVar1 != 0;
  }
  return (bool_t)local_9;
}

Assistant:

bool_t apduRespIsValid(const apdu_resp_t* resp)
{
	return memIsValid(resp, sizeof(apdu_resp_t)) &&
		resp->rdf_len <= 65536 &&
		memIsValid(resp->rdf, resp->rdf_len);
}